

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prim-types.hh
# Opt level: O3

void __thiscall tinyusdz::Attribute::set_value<tinyusdz::Token>(Attribute *this,Token *v)

{
  undefined4 *local_40;
  undefined8 local_38;
  undefined4 local_30;
  undefined2 uStack_2c;
  undefined2 uStack_2a;
  
  if ((this->_type_name)._M_string_length == 0) {
    local_30 = 0x656b6f74;
    uStack_2c = 0x6e;
    local_38 = 5;
    local_40 = &local_30;
    ::std::__cxx11::string::operator=((string *)&this->_type_name,(string *)&local_40);
    if (local_40 != &local_30) {
      operator_delete(local_40,CONCAT26(uStack_2a,CONCAT24(uStack_2c,local_30)) + 1);
    }
  }
  linb::any::operator=((any *)&this->_var,v);
  return;
}

Assistant:

void set_value(const T &v) {
    if (_type_name.empty()) {
      _type_name = value::TypeTraits<T>::type_name();
    }
    _var.set_value(v);
  }